

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdb_functional_test.cc
# Opt level: O2

void db_destroy_test_full_path(void)

{
  int iVar1;
  fdb_status fVar2;
  time_t tVar3;
  char *__format;
  fdb_file_handle *dbfile;
  timeval __test_begin;
  char cmd [256];
  char path [256];
  fdb_file_handle *local_328;
  timeval local_320;
  fdb_config local_310;
  char local_218 [256];
  char local_118 [256];
  
  gettimeofday(&local_320,(__timezone_ptr_t)0x0);
  memleak_start();
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar1 = rand();
  sprintf(local_118,"/tmp/fdb_destroy_test_%d",(long)iVar1 % 10000 & 0xffffffff);
  sprintf(local_218,"rm -rf %s*",local_118);
  system(local_218);
  fdb_get_default_config();
  local_310.compaction_mode = '\x01';
  fdb_open(&local_328,local_118,&local_310);
  fdb_close(local_328);
  fVar2 = fdb_destroy(local_118,&local_310);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fdb_shutdown();
    memleak_end();
    __format = "%s PASSED\n";
    if (db_destroy_test_full_path()::__test_pass != '\0') {
      __format = "%s FAILED\n";
    }
    fprintf(_stderr,__format,"Database destroy (full path) test");
    return;
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
          ,0x5ea);
  db_destroy_test_full_path()::__test_pass = 1;
  __assert_fail("s == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/fdb_functional_test.cc"
                ,0x5ea,"void db_destroy_test_full_path()");
}

Assistant:

void db_destroy_test_full_path()
{
    TEST_INIT();

    memleak_start();
    randomize();

    int r;
    fdb_file_handle *dbfile;
    fdb_config config;
    fdb_status s;
    char path[256];
    char cmd[256];

    sprintf(path, "/tmp/fdb_destroy_test_%d", random(10000));

    sprintf(cmd, "rm -rf %s*", path);
    r = system(cmd); (void)r;

    config = fdb_get_default_config();
    config.compaction_mode = FDB_COMPACTION_AUTO;

    fdb_open(&dbfile, path, &config);
    fdb_close(dbfile);

    s = fdb_destroy(path, &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    fdb_shutdown();

    memleak_end();

    TEST_RESULT("Database destroy (full path) test");
}